

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testInit
          (VaryingLocationAliasingWithMixedInterpolationTest *this)

{
  Type TVar1;
  Type TVar2;
  GLuint GVar3;
  GLuint int_gohan;
  INTERPOLATIONS IVar4;
  GLuint index;
  GLuint index_00;
  vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase>_>
  *this_00;
  vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase>_>
  *this_01;
  GLuint int_goten;
  INTERPOLATIONS IVar5;
  GLuint stage;
  STAGES SVar6;
  Type TVar7;
  Type TVar8;
  TYPES local_a8;
  value_type local_90;
  value_type local_60;
  
  TVar1.m_n_rows = local_60.m_type_gohan.m_n_rows;
  TVar1._0_8_ = local_60.m_type_gohan._0_8_;
  this_00 = &this->m_test_cases;
  index_00 = 0;
  this_01 = this_00;
  do {
    if (index_00 == 0x22) {
      return;
    }
    local_60.m_type_gohan = TVar1;
    TVar7 = TestBase::getType((TestBase *)this_01,index_00);
    GVar3 = TVar7.m_n_rows;
    TVar1 = local_60.m_type_gohan;
    if ((TVar7._0_8_ & 0xffffffff00000000) == 0x100000000) {
      for (index = 0; index != 0x22; index = index + 1) {
        local_a8 = TVar7.m_basic_type;
        local_60.m_type_gohan = TVar1;
        TVar8 = TestBase::getType((TestBase *)this_01,index);
        TVar1 = local_60.m_type_gohan;
        if ((((TVar8._0_8_ & 0xffffffff00000000) == 0x100000000) &&
            (local_a8 < Int == TVar8.m_basic_type < Int)) && (TVar8.m_n_rows + GVar3 < 5)) {
          SVar6 = COMPUTE;
          do {
            if (SVar6 != COMPUTE) {
              if (SVar6 == STAGE_MAX) break;
              for (IVar4 = SMOOTH; IVar4 != INTERPOLATION_MAX; IVar4 = IVar4 + FLAT) {
                for (IVar5 = SMOOTH; IVar5 != INTERPOLATION_MAX; IVar5 = IVar5 + FLAT) {
                  if (IVar4 != IVar5) {
                    local_60.m_component_gohan = 0;
                    local_60.m_is_input = true;
                    local_90.m_component_gohan = 0;
                    local_90.m_is_input = false;
                    local_90.m_interpolation_gohan = IVar4;
                    local_90.m_interpolation_goten = IVar5;
                    local_90.m_stage = SVar6;
                    local_90.m_type_goten = TVar8;
                    local_60.m_component_goten = GVar3;
                    local_60.m_interpolation_gohan = IVar4;
                    local_60.m_interpolation_goten = IVar5;
                    local_60.m_stage = SVar6;
                    local_60.m_type_gohan.m_n_rows = GVar3;
                    local_60.m_type_goten = TVar8;
                    local_90.m_type_gohan = TVar7;
                    TVar2 = TVar7;
                    if (SVar6 == VERTEX) {
LAB_0096cb31:
                      local_90.m_component_goten = TVar2.m_n_rows;
                      local_60.m_type_gohan._0_8_ = TVar2._0_8_;
                      this_01 = this_00;
                      std::
                      vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase>_>
                      ::push_back(this_00,&local_90);
                      TVar1.m_n_rows = local_60.m_type_gohan.m_n_rows;
                      TVar1.m_basic_type = local_60.m_type_gohan.m_basic_type;
                      TVar1.m_n_columns = local_60.m_type_gohan.m_n_columns;
                    }
                    else {
                      local_90.m_component_goten = GVar3;
                      if ((SVar6 != FRAGMENT) ||
                         (TVar1 = TVar7,
                         (TVar8.m_basic_type != Double || IVar5 == FLAT) &&
                         (IVar4 == FLAT || local_a8 != Double))) {
                        this_01 = this_00;
                        local_60.m_type_gohan = TVar7;
                        std::
                        vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase>_>
                        ::push_back(this_00,&local_60);
                        TVar1 = local_60.m_type_gohan;
                        TVar2.m_n_rows = local_90.m_component_goten;
                        TVar2.m_basic_type = local_60.m_type_gohan.m_basic_type;
                        TVar2.m_n_columns = local_60.m_type_gohan.m_n_columns;
                        if (SVar6 != FRAGMENT) goto LAB_0096cb31;
                      }
                    }
                  }
                }
              }
            }
            SVar6 = SVar6 + VERTEX;
          } while( true );
        }
      }
    }
    index_00 = index_00 + 1;
  } while( true );
}

Assistant:

void VaryingLocationAliasingWithMixedInterpolationTest::testInit()
{
	static const GLuint n_components_per_location = 4;
	const GLuint		n_types					  = getTypesNumber();

	for (GLuint i = 0; i < n_types; ++i)
	{
		const Utils::Type& type_gohan		   = getType(i);
		const bool		   is_float_type_gohan = isFloatType(type_gohan);

		/* Skip matrices */
		if (1 != type_gohan.m_n_columns)
		{
			continue;
		}

		for (GLuint j = 0; j < n_types; ++j)
		{
			const Utils::Type& type_goten		   = getType(j);
			const bool		   is_float_type_goten = isFloatType(type_goten);

			/* Skip matrices */
			if (1 != type_goten.m_n_columns)
			{
				continue;
			}

			/* Skip invalid combinations */
			if (is_float_type_gohan != is_float_type_goten)
			{
				continue;
			}

			const GLuint n_req_components_gohan = type_gohan.m_n_rows;
			const GLuint n_req_components_goten = type_goten.m_n_rows;

			/* Skip pairs that cannot fit into one location */
			if (n_components_per_location < (n_req_components_gohan + n_req_components_goten))
			{
				continue;
			}

			for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
			{
				/* Skip compute shader */
				if (Utils::Shader::COMPUTE == stage)
				{
					continue;
				}

				const GLuint gohan = 0;
				const GLuint goten = gohan + n_req_components_gohan;

				for (GLuint int_gohan = 0; int_gohan < INTERPOLATION_MAX; ++int_gohan)
				{
					for (GLuint int_goten = 0; int_goten < INTERPOLATION_MAX; ++int_goten)
					{
						const bool is_gohan_double = (Utils::Type::Double == type_gohan.m_basic_type) ? true : false;
						const bool is_goten_double = (Utils::Type::Double == type_goten.m_basic_type) ? true : false;
						const bool is_gohan_flat   = (FLAT == int_gohan) ? true : false;
						const bool is_goten_flat   = (FLAT == int_goten) ? true : false;
						const bool is_gohan_accepted_as_fs_in =
							(is_gohan_double && is_gohan_flat) || (!is_gohan_double);
						const bool is_goten_accepted_as_fs_in =
							(is_goten_double && is_goten_flat) || (!is_goten_double);
						const bool is_comb_accepted_as_fs_in = is_gohan_accepted_as_fs_in && is_goten_accepted_as_fs_in;

						/* Skip when both are the same */
						if (int_gohan == int_goten)
						{
							continue;
						}

						testCase test_case_in = { gohan,
												  goten,
												  (INTERPOLATIONS)int_gohan,
												  (INTERPOLATIONS)int_goten,
												  true,
												  (Utils::Shader::STAGES)stage,
												  type_gohan,
												  type_goten };

						testCase test_case_out = { gohan,
												   goten,
												   (INTERPOLATIONS)int_gohan,
												   (INTERPOLATIONS)int_goten,
												   false,
												   (Utils::Shader::STAGES)stage,
												   type_gohan,
												   type_goten };

						/* Skip inputs in:
						 * vertex shader,
						 * fragment shader when not flat double is used
						 */
						if ((Utils::Shader::VERTEX != stage) &&
							((Utils::Shader::FRAGMENT != stage) || (true == is_comb_accepted_as_fs_in)))
						{
							m_test_cases.push_back(test_case_in);
						}

						/* Skip outputs in fragment shader */
						if (Utils::Shader::FRAGMENT != stage)
						{
							m_test_cases.push_back(test_case_out);
						}
					}
				}
			}
		}
	}
}